

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall sim_case__Test::TestBody(sim_case__Test *this)

{
  undefined1 var [8];
  __node_base var_00;
  bool bVar1;
  Generator *pGVar2;
  Var *pVVar3;
  Port *pPVar4;
  element_type *peVar5;
  StmtBlock *this_00;
  char *pcVar6;
  unsigned_long *lhs;
  optional<unsigned_long> oVar7;
  optional<unsigned_long> value;
  AssertHelper local_4d0;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_1;
  undefined7 uStack_49f;
  int local_494;
  undefined1 local_490 [12];
  int local_47c;
  undefined1 local_478 [12];
  AssertHelper local_468;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar;
  optional<unsigned_long> v;
  Simulator sim;
  undefined1 local_280 [32];
  shared_ptr<kratos::Const> local_260;
  undefined1 local_250 [32];
  undefined1 local_230 [16];
  undefined1 local_220 [8];
  shared_ptr<kratos::SwitchStmt> case_;
  shared_ptr<kratos::CombinationalStmtBlock> comb;
  string local_1f8;
  Port *local_1d8;
  Port *in;
  string local_1c8;
  undefined1 local_1a8 [8];
  Var *b;
  string local_198;
  __node_base local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context context;
  sim_case__Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"a",(allocator<char> *)((long)&b + 7));
  pVVar3 = kratos::Generator::var(pGVar2,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  pGVar2 = local_138;
  local_178._M_nxt = (_Hash_node_base *)pVVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"b",(allocator<char> *)((long)&in + 7));
  pVVar3 = kratos::Generator::var(pGVar2,&local_1c8,1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in + 7));
  pGVar2 = local_138;
  local_1a8 = (undefined1  [8])pVVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"in",
             (allocator<char> *)
             ((long)&comb.
                     super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pPVar4 = kratos::Generator::port(pGVar2,In,&local_1f8,1);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&comb.
                     super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_1d8 = pPVar4;
  kratos::Generator::combinational
            ((Generator *)
             &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::make_shared<kratos::SwitchStmt,kratos::Port&>((Port *)local_220);
  peVar5 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_220);
  kratos::constant(1,1,false);
  kratos::Var::as<kratos::Const>((Var *)local_230);
  kratos::Var::assign((Var *)local_250,(Var *)local_178._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_250 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_250);
  kratos::SwitchStmt::add_switch_case
            (peVar5,(shared_ptr<kratos::Const> *)local_230,
             (shared_ptr<kratos::Stmt> *)(local_250 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_250 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_250);
  std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_230);
  peVar5 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_220);
  std::shared_ptr<kratos::Const>::shared_ptr(&local_260,(nullptr_t)0x0);
  var_00._M_nxt = local_178._M_nxt;
  kratos::constant(0,1,false);
  kratos::Var::assign((Var *)local_280,(Var *)var_00._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_280 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_280);
  kratos::SwitchStmt::add_switch_case
            (peVar5,&local_260,(shared_ptr<kratos::Stmt> *)(local_280 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_280 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_280);
  std::shared_ptr<kratos::Const>::~shared_ptr(&local_260);
  this_00 = &std::
             __shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&case_.
                              super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount)->super_StmtBlock;
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::SwitchStmt,void>
            ((shared_ptr<kratos::Stmt> *)&sim.simulation_depth_,
             (shared_ptr<kratos::SwitchStmt> *)local_220);
  kratos::StmtBlock::add_stmt(this_00,(shared_ptr<kratos::Stmt> *)&sim.simulation_depth_);
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&sim.simulation_depth_);
  kratos::Simulator::Simulator
            ((Simulator *)
             &v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,local_138);
  oVar7 = kratos::Simulator::get
                    ((Simulator *)
                     &v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,(Var *)local_178._M_nxt
                    );
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  testing::internal::EqHelper::Compare<std::optional<unsigned_long>,_std::nullopt_t,_nullptr>
            ((EqHelper *)local_458,"v","std::nullopt",(optional<unsigned_long> *)&gtest_ar.message_,
             (nullopt_t *)&std::nullopt);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0xd3,pcVar6);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  pPVar4 = local_1d8;
  local_47c = 1;
  std::optional<unsigned_long>::optional<int,_true>((optional<unsigned_long> *)local_478,&local_47c)
  ;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_478._0_8_;
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_478[8];
  oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_478._9_3_;
  kratos::Simulator::set
            ((Simulator *)
             &v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,&pPVar4->super_Var,oVar7,true);
  var = local_1a8;
  local_494 = 1;
  std::optional<unsigned_long>::optional<int,_true>((optional<unsigned_long> *)local_490,&local_494)
  ;
  value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_490._0_8_;
  value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_490[8];
  value.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_490._9_3_;
  kratos::Simulator::set
            ((Simulator *)
             &v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged,(Var *)var,value,true);
  oVar7 = kratos::Simulator::get
                    ((Simulator *)
                     &v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged,(Var *)local_178._M_nxt
                    );
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._1_7_ = uStack_49f;
  v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       gtest_ar_1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  lhs = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&gtest_ar.message_);
  local_4bc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4b8,"*v","1",lhs,&local_4bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0xd7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  kratos::Simulator::~Simulator
            ((Simulator *)
             &v.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged);
  std::shared_ptr<kratos::SwitchStmt>::~shared_ptr((shared_ptr<kratos::SwitchStmt> *)local_220);
  std::shared_ptr<kratos::CombinationalStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::CombinationalStmtBlock> *)
             &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(sim, case_) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    auto &in = mod.port(PortDirection::In, "in", 1);
    auto comb = mod.combinational();
    auto case_ = std::make_shared<SwitchStmt>(in);
    case_->add_switch_case(constant(1, 1).as<Const>(), a.assign(b));
    case_->add_switch_case(nullptr, a.assign(constant(0, 1)));
    comb->add_stmt(case_);

    Simulator sim(&mod);
    auto v = sim.get(&a);
    EXPECT_EQ(v, std::nullopt);
    sim.set(&in, 1);
    sim.set(&b, 1);
    v = sim.get(&a);
    EXPECT_EQ(*v, 1);
}